

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O0

Status leveldb::WriteBatchInternal::InsertInto(WriteBatch *b,MemTable *memtable)

{
  MemTableInserter *in_RDI;
  MemTableInserter inserter;
  Handler *in_stack_000000c0;
  WriteBatch *in_stack_000000c8;
  
  anon_unknown_11::MemTableInserter::MemTableInserter(in_RDI);
  Sequence((WriteBatch *)0x10ce44);
  WriteBatch::Iterate(in_stack_000000c8,in_stack_000000c0);
  anon_unknown_11::MemTableInserter::~MemTableInserter((MemTableInserter *)0x10ce71);
  return (Status)(char *)in_RDI;
}

Assistant:

Status WriteBatchInternal::InsertInto(const WriteBatch* b, MemTable* memtable) {
  MemTableInserter inserter;
  inserter.sequence_ = WriteBatchInternal::Sequence(b);
  inserter.mem_ = memtable;
  return b->Iterate(&inserter);
}